

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cc
# Opt level: O2

void raptor::LogFormatPrint(char *file,int line,LogLevel level,char *format,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *message;
  va_list args;
  LogArgument tmp;
  char *local_100;
  undefined8 local_f8;
  char **local_f0;
  undefined1 *local_e8;
  char *local_e0;
  int local_d8;
  LogLevel local_d4;
  char *local_d0;
  undefined1 local_c8 [32];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  local_e8 = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_100 = (char *)0x0;
  local_f0 = &message;
  local_f8 = 0x3000000020;
  local_a8 = in_R8;
  local_a0 = in_R9;
  iVar1 = vasprintf(&local_100,format,&local_f8);
  if (iVar1 != -1) {
    if (_ZN6raptor12_GLOBAL__N_111g_min_levelE_0 <= (int)level) {
      local_d0 = local_100;
      local_e0 = file;
      local_d8 = line;
      local_d4 = level;
      (*(code *)_ZN6raptor12_GLOBAL__N_114g_log_functionE_0)();
    }
    Free(local_100);
  }
  return;
}

Assistant:

void LogFormatPrint(
                    const char* file,
                    int line,
                    LogLevel level,
                    const char* format, ...) {

    char* message = NULL;
    va_list args;
    va_start(args, format);

#ifdef _WIN32
    int ret = _vscprintf(format, args);
    va_end(args);
    if (ret < 0) {
        return;
    }

    size_t buff_len = (size_t)ret + 1;
    message = (char*)Malloc(buff_len);
    va_start(args, format);
    ret = vsnprintf_s(message, buff_len, _TRUNCATE, format, args);
    va_end(args);
#else
    if (vasprintf(&message, format, args) == -1) {  // stdio.h
        va_end(args);
        return;
    }
#endif

    if (g_min_level.Load() <= static_cast<intptr_t>(level)) {
        LogArgument tmp;
        tmp.file = file;
        tmp.line = line;
        tmp.level = level;
        tmp.message = message;
        ((LogTransferFunction)g_log_function.Load())(&tmp);
    }
    Free(message);
}